

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadPool.h
# Opt level: O0

void __thiscall
sing::ThreadPool::
pushTask<std::_Bind<void(sing::HttpServer::*(sing::HttpServer*,sing::HttpContext*))(sing::HttpContext*)>>
          (ThreadPool *this,
          _Bind<void_(sing::HttpServer::*(sing::HttpServer_*,_sing::HttpContext_*))(sing::HttpContext_*)>
          *task)

{
  element_type *peVar1;
  lock_guard<std::mutex> local_20;
  lock_guard<std::mutex> lock;
  _Bind<void_(sing::HttpServer::*(sing::HttpServer_*,_sing::HttpContext_*))(sing::HttpContext_*)>
  *task_local;
  ThreadPool *this_local;
  
  lock._M_device = (mutex_type *)task;
  peVar1 = std::
           __shared_ptr_access<sing::ThreadPool::poolData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<sing::ThreadPool::poolData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
  std::lock_guard<std::mutex>::lock_guard(&local_20,&peVar1->mutex);
  peVar1 = std::
           __shared_ptr_access<sing::ThreadPool::poolData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<sing::ThreadPool::poolData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
  std::
  queue<std::function<void()>,std::deque<std::function<void()>,std::allocator<std::function<void()>>>>
  ::
  emplace<std::_Bind<void(sing::HttpServer::*(sing::HttpServer*,sing::HttpContext*))(sing::HttpContext*)>>
            ((queue<std::function<void()>,std::deque<std::function<void()>,std::allocator<std::function<void()>>>>
              *)&peVar1->tasksQueue,
             (_Bind<void_(sing::HttpServer::*(sing::HttpServer_*,_sing::HttpContext_*))(sing::HttpContext_*)>
              *)lock._M_device);
  std::lock_guard<std::mutex>::~lock_guard(&local_20);
  std::__shared_ptr_access<sing::ThreadPool::poolData,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<sing::ThreadPool::poolData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)this);
  std::condition_variable::notify_one();
  return;
}

Assistant:

void pushTask(F&& task){
        {
            std::lock_guard<std::mutex> lock(pool_->mutex);
            pool_->tasksQueue.emplace(std::forward<F>(task));//使用forward完美转发，保持task原有的右值特征
        }
        pool_->cond.notify_one();;
    }